

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

VkExtent2D Diligent::ShadingRateToVkFragmentSize(SHADING_RATE Rate)

{
  VkExtent2D VVar1;
  bool bVar2;
  uint val;
  uint val_00;
  Char *pCVar3;
  char (*Args_1) [96];
  undefined1 local_88 [8];
  string msg_2;
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  SHADING_RATE Rate_local;
  VkExtent2D Result;
  
  val = 1 << (Rate >> 2 & 3);
  Args_1 = (char (*) [96])(ulong)(Rate & 3);
  val_00 = 1 << (sbyte)(Rate & 3);
  msg.field_2._M_local_buf[0xf] = Rate;
  if ((val == 0) || (val_00 == 0)) {
    FormatString<char[26],char[38]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Result.width > 0 && Result.height > 0",(char (*) [38])Args_1);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    Args_1 = (char (*) [96])0x773;
    DebugAssertionFailed
              (pCVar3,"ShadingRateToVkFragmentSize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x773);
    std::__cxx11::string::~string((string *)local_38);
  }
  if ((4 < val) || (4 < val_00)) {
    FormatString<char[26],char[96]>
              ((string *)((long)&msg_2.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "Result.width <= (1u << AXIS_SHADING_RATE_MAX) && Result.height <= (1u << AXIS_SHADING_RATE_MAX)"
               ,Args_1);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    Args_1 = (char (*) [96])0x774;
    DebugAssertionFailed
              (pCVar3,"ShadingRateToVkFragmentSize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x774);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  bVar2 = IsPowerOfTwo<unsigned_int>(val);
  if ((!bVar2) || (bVar2 = IsPowerOfTwo<unsigned_int>(val_00), !bVar2)) {
    FormatString<char[26],char[58]>
              ((string *)local_88,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"IsPowerOfTwo(Result.width) && IsPowerOfTwo(Result.height)",
               (char (*) [58])Args_1);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"ShadingRateToVkFragmentSize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x775);
    std::__cxx11::string::~string((string *)local_88);
  }
  VVar1.height = val_00;
  VVar1.width = val;
  return VVar1;
}

Assistant:

VkExtent2D ShadingRateToVkFragmentSize(SHADING_RATE Rate)
{
    VkExtent2D Result;
    Result.width  = 1u << ((Uint32{Rate} >> SHADING_RATE_X_SHIFT) & 0x3);
    Result.height = 1u << (Uint32{Rate} & 0x3);
    VERIFY_EXPR(Result.width > 0 && Result.height > 0);
    VERIFY_EXPR(Result.width <= (1u << AXIS_SHADING_RATE_MAX) && Result.height <= (1u << AXIS_SHADING_RATE_MAX));
    VERIFY_EXPR(IsPowerOfTwo(Result.width) && IsPowerOfTwo(Result.height));
    return Result;
}